

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# File.cpp
# Opt level: O0

bool __thiscall File::isEmpty(File *this)

{
  int iVar1;
  long in_RDI;
  stat s;
  stat local_a0;
  bool local_1;
  
  iVar1 = fileno(*(FILE **)(in_RDI + 0x30));
  iVar1 = fstat(iVar1,&local_a0);
  if (iVar1 != 0) {
    *(undefined1 *)(in_RDI + 0x28) = 0;
  }
  local_1 = iVar1 == 0 && local_a0.st_size == 0;
  return local_1;
}

Assistant:

bool File::isEmpty()
{
#ifndef _WIN32
	struct stat s;

	if (fstat(fileno(stream), &s) != 0)
	{
		valid = false;

		return false;
	}

	return (s.st_size == 0);
#else
	struct _stat s;

	if (_fstat(_fileno(stream), &s) != 0)
	{
		valid = false;

		return false;
	}

	return (s.st_size == 0);
#endif
}